

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorExport.cpp
# Opt level: O0

int helicsTranslatorGetOption(HelicsTranslator trans,int option)

{
  TranslatorObject *pTVar1;
  uint in_ESI;
  TranslatorObject *transObj;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  HelicsTranslator in_stack_ffffffffffffffd8;
  int local_4;
  
  pTVar1 = getTranslatorObj(in_stack_ffffffffffffffd8,
                            (HelicsError *)
                            CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (pTVar1 == (TranslatorObject *)0x0) {
    local_4 = 0;
  }
  else {
    local_4 = (*(pTVar1->transPtr->super_Interface)._vptr_Interface[3])
                        (pTVar1->transPtr,(ulong)in_ESI);
  }
  return local_4;
}

Assistant:

int helicsTranslatorGetOption(HelicsTranslator trans, int option)
{
    auto* transObj = getTranslatorObj(trans, nullptr);
    if (transObj == nullptr) {
        return HELICS_FALSE;
    }
    try {
        return transObj->transPtr->getOption(option);
    }
    // LCOV_EXCL_START
    catch (...) {
        return HELICS_FALSE;
    }
    // LCOV_EXCL_STOP
}